

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O0

InstanceBodySymbol * __thiscall slang::ast::Symbol::as<slang::ast::InstanceBodySymbol>(Symbol *this)

{
  Symbol *this_local;
  
  return (InstanceBodySymbol *)this;
}

Assistant:

decltype(auto) as() {
        if constexpr (std::is_same_v<T, Scope>) {
            const Scope* scope = scopeOrNull();
            SLANG_ASSERT(scope);
            return *scope;
        }
        else {
            SLANG_ASSERT(T::isKind(kind));
            return *static_cast<T*>(this);
        }
    }